

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heady.hpp
# Opt level: O1

void Heady::Detail::FindAndProcessLocalIncludes
               (list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *dirEntries,string *include,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *processed,string *outputText)

{
  pointer pcVar1;
  iterator iVar2;
  _List_const_iterator<std::filesystem::__cxx11::directory_entry> _Var3;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&processed->_M_t,include);
  if ((_Rb_tree_header *)iVar2._M_node == &(processed->_M_t)._M_impl.super__Rb_tree_header) {
    _Var3._M_node =
         (dirEntries->
         super__List_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    pcVar1 = (include->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + include->_M_string_length);
    _Var3 = std::
            find_if<std::_List_const_iterator<std::filesystem::__cxx11::directory_entry>,Heady::Detail::FindAndProcessLocalIncludes(std::__cxx11::list<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>const&,std::__cxx11::string_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)::_lambda(auto:1_const&)_1_>
                      (_Var3,(_List_const_iterator<std::filesystem::__cxx11::directory_entry>)
                             dirEntries,(anon_class_32_1_f7238788_for__M_pred *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (_Var3._M_node != (_List_node_base *)dirEntries) {
      FindAndProcessLocalIncludes
                (dirEntries,(directory_entry *)(_Var3._M_node + 1),processed,outputText);
    }
  }
  return;
}

Assistant:

inline void FindAndProcessLocalIncludes(const std::list<std::filesystem::directory_entry> & dirEntries, const std::string & include, std::set<std::string> & processed, std::string & outputText)
		{
			// Check to see if we've already processed this file
			if (processed.find(include) != processed.end())
				return;

			// Find the directory entry that matches this include filename, and if found, process it
			auto itr = std::find_if(dirEntries.begin(), dirEntries.end(), [include](const auto & entry)
			{
				return EndsWith(entry.path().string(), include);
			});
			if (itr != dirEntries.end())
			{
				FindAndProcessLocalIncludes(dirEntries, *itr, processed, outputText);
			}
		}